

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LoopConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LoopConstraintSyntax,slang::parsing::Token&,slang::syntax::ForeachLoopListSyntax&,slang::syntax::ConstraintItemSyntax&>
          (BumpAllocator *this,Token *args,ForeachLoopListSyntax *args_1,
          ConstraintItemSyntax *args_2)

{
  Token foreachKeyword;
  LoopConstraintSyntax *this_00;
  ConstraintItemSyntax *args_local_2;
  ForeachLoopListSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (LoopConstraintSyntax *)allocate(this,0x30,8);
  foreachKeyword.kind = args->kind;
  foreachKeyword._2_1_ = args->field_0x2;
  foreachKeyword.numFlags.raw = (args->numFlags).raw;
  foreachKeyword.rawLen = args->rawLen;
  foreachKeyword.info = args->info;
  slang::syntax::LoopConstraintSyntax::LoopConstraintSyntax(this_00,foreachKeyword,args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }